

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O2

void visit_identifier_expr(gvisitor_t *self,gnode_identifier_expr_t *node)

{
  gnode_t *pgVar1;
  
  pgVar1 = lookup_identifier(self,node->value,node);
  if (pgVar1 != (gnode_t *)0x0) {
    return;
  }
  report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,"Identifier %s not found.",node->value);
  return;
}

Assistant:

static void visit_identifier_expr (gvisitor_t *self, gnode_identifier_expr_t *node) {
    DEBUG_CODEGEN("visit_identifier_expr %s", node->value);
    DECLARE_CODE();

    CODEGEN_COUNT_REGISTERS(n1);

    // check if the node is a left expression of an assignment
    bool is_assignment = node->base.is_assignment;

    const char            *identifier = node->value;        // identifier as c string
    gnode_location_type    type = node->location.type;        // location type
    uint16_t            index = node->location.index;    // symbol index
    uint16_t            nup = node->location.nup;        // upvalue index or outer index

    switch (type) {

        // local variable
        case LOCATION_LOCAL: {
            if (is_assignment) {
                uint32_t reg = ircode_register_pop(code);
                if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid identifier expression.");
				ircode_add(code, MOVE, index, reg, 0, LINE_NUMBER(node));
            } else {
                ircode_register_push(code, index);
            }
        } break;

        // module (global) variable
        case LOCATION_GLOBAL: {
            uint16_t kindex = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, identifier));
            if (is_assignment) {
                uint32_t reg = ircode_register_pop(code);
                if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid identifier expression.");
				ircode_add(code, STOREG, reg, kindex, 0, LINE_NUMBER(node));
            } else {
				ircode_add(code, LOADG, ircode_register_push_temp(code), kindex, 0, LINE_NUMBER(node));
            }
        } break;

        // upvalue access
        case LOCATION_UPVALUE: {
            gupvalue_t *upvalue = node->upvalue;
            if (is_assignment) {
                uint32_t reg = ircode_register_pop(code);
                if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid identifier expression.");
				ircode_add(code, STOREU, reg, upvalue->selfindex, 0, LINE_NUMBER(node));
            } else {
				ircode_add(code, LOADU, ircode_register_push_temp(code), upvalue->selfindex, 0, LINE_NUMBER(node));
            }
        } break;

        // class ivar case (outer case just need a loop lookup before)
        case LOCATION_CLASS_IVAR_OUTER:
        case LOCATION_CLASS_IVAR_SAME: {
            // needs to differentiate ivar (indexed by an integer) from other cases (indexed by a string)
            bool        is_ivar = (index != UINT16_MAX);
            uint32_t    dest = 0;
            uint32_t    target = 0;

            if (type == LOCATION_CLASS_IVAR_OUTER) {
                dest = ircode_register_push_temp(code);
                for (uint16_t i=0; i<nup; ++i) {
					ircode_add(code, LOAD, dest, target, 0 + MAX_REGISTERS, LINE_NUMBER(node));
                    target = dest;
                }
                if (is_assignment) {
                    uint32_t temp = ircode_register_pop(code);
                    DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");
                }
            }

            uint32_t index_register;
            if (is_ivar) {
                // ivar case, use an index to load/retrieve it
                index_register = index + MAX_REGISTERS;
            } else {
                // not an ivar so it could be another class declaration like a func, a class or an enum
                // use lookup in order to retrieve it (assignment is handled here so you can change a
                // first class citizen at runtime too)
                uint16_t kindex = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, identifier));
                index_register = ircode_register_push_temp(code);
				ircode_add(code, LOADK, index_register, kindex, 0, LINE_NUMBER(node));
                uint32_t temp = ircode_register_pop(code);
                DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");
            }

            if (is_assignment) {
                // should be prohibited by semantic to store something into a non ivar slot?
                dest = ircode_register_pop(code); // consume temp register
                if (dest == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid identifier expression.");
				ircode_add(code, STORE, dest, target, index_register, LINE_NUMBER(node));
            } else {
                dest = (type == LOCATION_CLASS_IVAR_OUTER) ? target : ircode_register_push_temp(code);
				ircode_add(code, LOAD, dest , target, index_register, LINE_NUMBER(node));
            }
        } break;
    }

    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, (is_assignment) ? -1 : 1);
}